

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O1

ref<immutable::rrb<int,_false,_6>_> __thiscall
immutable::rrb_concat<int,false,6>
          (immutable *this,ref<immutable::rrb<int,_false,_6>_> *left,
          ref<immutable::rrb<int,_false,_6>_> *right)

{
  uint32_t *puVar1;
  ref<immutable::rrb_details::tree_node<int,_false>_> *__s;
  uint uVar2;
  rrb<int,_false,_6> *prVar3;
  rrb<int,_false,_6> *prVar4;
  tree_node<int,_false> *ptVar5;
  leaf_node<int,_false> *plVar6;
  long lVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  undefined4 uVar10;
  uint32_t uVar11;
  ref<immutable::rrb<int,_false,_6>_> rVar12;
  uint32_t uVar13;
  int *piVar14;
  leaf_node<int,_false> *plVar15;
  char *__function;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  ref<immutable::rrb_details::leaf_node<int,_false>_> *this_00;
  ref<immutable::rrb<int,_false,_6>_> new_rrb;
  ref<immutable::rrb_details::leaf_node<int,_false>_> empty_leaf;
  ref<immutable::rrb<int,_false,_6>_> left2;
  ref<immutable::rrb<int,_false,_6>_> left_head;
  ref<immutable::rrb_details::internal_node<int,_false>_> root_candidate;
  ref<immutable::rrb_details::tree_node<int,_false>_> find_shift_arg;
  ref<immutable::rrb<int,_false,_6>_> local_88;
  ref<immutable::rrb_details::leaf_node<int,_false>_> local_80;
  ref<immutable::rrb<int,_false,_6>_> local_78;
  ref<immutable::rrb<int,_false,_6>_> local_70;
  leaf_node<int,_false> *local_68;
  ref<immutable::rrb_details::internal_node<int,_false>_> local_60;
  ref<immutable::rrb_details::tree_node<int,_false>_> local_58;
  uint32_t local_4c;
  rrb<int,_false,_6> *local_48;
  internal_node<int,_false> *local_40;
  ulong local_38;
  
  prVar3 = left->ptr;
  if (prVar3 != (rrb<int,_false,_6> *)0x0) {
    prVar4 = right->ptr;
    if (prVar3->cnt == 0) {
      *(rrb<int,_false,_6> **)this = prVar4;
      if (prVar4 == (rrb<int,_false,_6> *)0x0) {
        return (ref<immutable::rrb<int,_false,_6>_>)(rrb<int,_false,_6> *)this;
      }
      prVar4->_ref_count = prVar4->_ref_count + 1;
      return (ref<immutable::rrb<int,_false,_6>_>)(rrb<int,_false,_6> *)this;
    }
    if (prVar4 != (rrb<int,_false,_6> *)0x0) {
      if (prVar4->cnt == 0) {
        *(rrb<int,_false,_6> **)this = prVar3;
        prVar3->_ref_count = prVar3->_ref_count + 1;
        return (ref<immutable::rrb<int,_false,_6>_>)(rrb<int,_false,_6> *)this;
      }
      if ((prVar4->root).ptr == (tree_node<int,_false> *)0x0) {
        local_88.ptr = (rrb<int,_false,_6> *)malloc(0x28);
        uVar13 = prVar3->cnt;
        uVar8 = prVar3->shift;
        uVar9 = prVar3->tail_len;
        uVar10 = *(undefined4 *)&prVar3->field_0xc;
        ptVar5 = (prVar3->root).ptr;
        ((local_88.ptr)->tail).ptr = (prVar3->tail).ptr;
        ((local_88.ptr)->root).ptr = ptVar5;
        (local_88.ptr)->cnt = uVar13;
        (local_88.ptr)->shift = uVar8;
        (local_88.ptr)->tail_len = uVar9;
        *(undefined4 *)&(local_88.ptr)->field_0xc = uVar10;
        uVar10 = *(undefined4 *)&prVar3->field_0x24;
        (local_88.ptr)->_ref_count = prVar3->_ref_count;
        *(undefined4 *)&(local_88.ptr)->field_0x24 = uVar10;
        ptVar5 = ((local_88.ptr)->root).ptr;
        if (ptVar5 != (tree_node<int,_false> *)0x0) {
          puVar1 = &ptVar5->_ref_count;
          *puVar1 = *puVar1 + 1;
        }
        plVar6 = ((local_88.ptr)->tail).ptr;
        if (plVar6 != (leaf_node<int,_false> *)0x0) {
          puVar1 = &plVar6->_ref_count;
          *puVar1 = *puVar1 + 1;
        }
        if (local_88.ptr != (rrb<int,_false,_6> *)0x0) {
          (local_88.ptr)->_ref_count = 1;
          (local_88.ptr)->cnt = (local_88.ptr)->cnt + prVar4->cnt;
          if (prVar3->tail_len == 0x40) {
            (local_88.ptr)->tail_len = prVar4->tail_len;
            rrb_details::push_down_tail<int,false,6>
                      ((rrb_details *)this,left,&local_88,&prVar4->tail);
            goto LAB_0014b39c;
          }
          this_00 = &(local_88.ptr)->tail;
          uVar18 = prVar4->tail_len + prVar3->tail_len;
          local_48 = (rrb<int,_false,_6> *)this;
          if (uVar18 < 0x41) {
            plVar15 = (prVar3->tail).ptr;
            local_68 = (prVar4->tail).ptr;
            uVar17 = local_68->len + plVar15->len;
            local_80.ptr = (leaf_node<int,_false> *)malloc((ulong)uVar17 * 4 + 0x18);
            (local_80.ptr)->len = uVar17;
            (local_80.ptr)->type = LEAF_NODE;
            plVar6 = local_80.ptr + 1;
            (local_80.ptr)->child = (int *)plVar6;
            (local_80.ptr)->guid = 0;
            if (uVar17 != 0) {
              memset(plVar6,0,(ulong)uVar17 * 4);
            }
            uVar17 = plVar15->len;
            if ((ulong)uVar17 != 0) {
              piVar14 = plVar15->child;
              uVar16 = 0;
              do {
                (&plVar6->type)[uVar16] = piVar14[uVar16];
                uVar16 = uVar16 + 1;
              } while (uVar17 != uVar16);
            }
            uVar2 = local_68->len;
            if ((ulong)uVar2 != 0) {
              piVar14 = local_68->child;
              uVar16 = 0;
              do {
                (&plVar6->type)[uVar17 + (int)uVar16] = piVar14[uVar16];
                uVar16 = uVar16 + 1;
              } while (uVar2 != uVar16);
            }
            (local_80.ptr)->_ref_count = 1;
            ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=(this_00,&local_80);
            if (local_88.ptr == (rrb<int,_false,_6> *)0x0) goto LAB_0014b3b6;
            (local_88.ptr)->tail_len = uVar18;
            *(rrb<int,_false,_6> **)local_48 = local_88.ptr;
            (local_88.ptr)->_ref_count = (local_88.ptr)->_ref_count + 1;
            this = (immutable *)local_48;
LAB_0014b37f:
            if ((local_80.ptr != (leaf_node<int,_false> *)0x0) &&
               (uVar13 = (local_80.ptr)->_ref_count, (local_80.ptr)->_ref_count = uVar13 - 1,
               uVar13 == 1)) {
              free(local_80.ptr);
            }
LAB_0014b39c:
            ref<immutable::rrb<int,_false,_6>_>::~ref(&local_88);
            return (ref<immutable::rrb<int,_false,_6>_>)(rrb<int,_false,_6> *)this;
          }
          plVar15 = (leaf_node<int,_false> *)malloc(0x118);
          plVar15->type = LEAF_NODE;
          plVar15->len = 0x40;
          plVar6 = plVar15 + 1;
          plVar15->child = (int *)plVar6;
          plVar15->guid = 0;
          memset(plVar6,0,0x100);
          plVar15->_ref_count = 1;
          uVar18 = prVar3->tail_len;
          local_80.ptr = plVar15;
          if (uVar18 != 0) {
            plVar15 = (prVar3->tail).ptr;
            if (plVar15 != (leaf_node<int,_false> *)0x0) {
              piVar14 = plVar15->child;
              uVar16 = 0;
              do {
                (&plVar6->type)[uVar16] = piVar14[uVar16];
                uVar16 = uVar16 + 1;
                uVar18 = prVar3->tail_len;
              } while (uVar16 < uVar18);
              goto LAB_0014b1f0;
            }
LAB_0014b3d5:
            __function = 
            "T *immutable::ref<immutable::rrb_details::leaf_node<int, false>>::operator->() const [T = immutable::rrb_details::leaf_node<int, false>]"
            ;
            goto LAB_0014b3cb;
          }
LAB_0014b1f0:
          uVar17 = -(uVar18 - 0x40);
          if (uVar18 != 0x40) {
            plVar15 = (prVar4->tail).ptr;
            if (plVar15 == (leaf_node<int,_false> *)0x0) goto LAB_0014b3d5;
            piVar14 = plVar15->child;
            uVar16 = 0;
            do {
              (&plVar6->type)[prVar3->tail_len + (int)uVar16] = piVar14[uVar16];
              uVar16 = uVar16 + 1;
            } while (uVar17 != uVar16);
          }
          uVar13 = prVar4->tail_len;
          local_38 = (ulong)(uVar13 + (uVar18 - 0x40));
          local_68 = (leaf_node<int,_false> *)CONCAT44(local_68._4_4_,uVar17);
          local_70.ptr = (rrb<int,_false,_6> *)malloc(local_38 * 4 + 0x18);
          __s = &(local_70.ptr)->root;
          local_4c = uVar13 - (uint32_t)local_68;
          (local_70.ptr)->shift = local_4c;
          (local_70.ptr)->cnt = 0;
          ((local_70.ptr)->tail).ptr = (leaf_node<int,_false> *)__s;
          *(undefined4 *)&(local_70.ptr)->field_0xc = 0;
          if (local_4c != 0) {
            memset(__s,0,local_38 << 2);
          }
          uVar8 = local_4c;
          (local_70.ptr)->tail_len = 1;
          if (uVar13 != (uint32_t)local_68) {
            plVar6 = (prVar4->tail).ptr;
            if (plVar6 == (leaf_node<int,_false> *)0x0) goto LAB_0014b3d5;
            piVar14 = plVar6->child;
            uVar16 = 0;
            do {
              *(int *)((long)&__s->ptr + uVar16 * 4) = piVar14[(uint32_t)local_68 + (int)uVar16];
              uVar16 = uVar16 + 1;
            } while (local_4c + (local_4c == 0) != uVar16);
          }
          ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=(this_00,&local_80);
          this = (immutable *)local_48;
          rVar12.ptr = local_88.ptr;
          if (local_88.ptr != (rrb<int,_false,_6> *)0x0) {
            (local_88.ptr)->tail_len = uVar8;
            prVar3 = left->ptr;
            local_78.ptr = (rrb<int,_false,_6> *)malloc(0x28);
            uVar13 = prVar3->cnt;
            uVar9 = prVar3->shift;
            uVar11 = prVar3->tail_len;
            uVar10 = *(undefined4 *)&prVar3->field_0xc;
            ptVar5 = (prVar3->root).ptr;
            ((local_78.ptr)->tail).ptr = (prVar3->tail).ptr;
            ((local_78.ptr)->root).ptr = ptVar5;
            (local_78.ptr)->cnt = uVar13;
            (local_78.ptr)->shift = uVar9;
            (local_78.ptr)->tail_len = uVar11;
            *(undefined4 *)&(local_78.ptr)->field_0xc = uVar10;
            uVar10 = *(undefined4 *)&prVar3->field_0x24;
            (local_78.ptr)->_ref_count = prVar3->_ref_count;
            *(undefined4 *)&(local_78.ptr)->field_0x24 = uVar10;
            ptVar5 = ((local_78.ptr)->root).ptr;
            if (ptVar5 != (tree_node<int,_false> *)0x0) {
              puVar1 = &ptVar5->_ref_count;
              *puVar1 = *puVar1 + 1;
            }
            plVar6 = ((local_78.ptr)->tail).ptr;
            if (plVar6 != (leaf_node<int,_false> *)0x0) {
              puVar1 = &plVar6->_ref_count;
              *puVar1 = *puVar1 + 1;
            }
            if (local_78.ptr != (rrb<int,_false,_6> *)0x0) {
              (local_78.ptr)->_ref_count = 1;
              (local_78.ptr)->cnt = (rVar12.ptr)->cnt - uVar8;
              rrb_details::push_down_tail<int,false,6>
                        ((rrb_details *)this,&local_78,&local_88,
                         (ref<immutable::rrb_details::leaf_node<int,_false>_> *)&local_70);
              ref<immutable::rrb<int,_false,_6>_>::~ref(&local_78);
              if ((local_70.ptr != (rrb<int,_false,_6> *)0x0) &&
                 (uVar13 = (local_70.ptr)->tail_len, (local_70.ptr)->tail_len = uVar13 - 1,
                 uVar13 == 1)) {
                free(local_70.ptr);
              }
              goto LAB_0014b37f;
            }
          }
        }
      }
      else {
        local_80.ptr = (leaf_node<int,_false> *)0x0;
        local_70.ptr = (rrb<int,_false,_6> *)malloc(0x28);
        uVar13 = prVar3->cnt;
        uVar8 = prVar3->shift;
        uVar9 = prVar3->tail_len;
        uVar10 = *(undefined4 *)&prVar3->field_0xc;
        ptVar5 = (prVar3->root).ptr;
        ((local_70.ptr)->tail).ptr = (prVar3->tail).ptr;
        ((local_70.ptr)->root).ptr = ptVar5;
        (local_70.ptr)->cnt = uVar13;
        (local_70.ptr)->shift = uVar8;
        (local_70.ptr)->tail_len = uVar9;
        *(undefined4 *)&(local_70.ptr)->field_0xc = uVar10;
        uVar10 = *(undefined4 *)&prVar3->field_0x24;
        (local_70.ptr)->_ref_count = prVar3->_ref_count;
        *(undefined4 *)&(local_70.ptr)->field_0x24 = uVar10;
        ptVar5 = ((local_70.ptr)->root).ptr;
        if (ptVar5 != (tree_node<int,_false> *)0x0) {
          puVar1 = &ptVar5->_ref_count;
          *puVar1 = *puVar1 + 1;
        }
        plVar6 = ((local_70.ptr)->tail).ptr;
        if (plVar6 != (leaf_node<int,_false> *)0x0) {
          puVar1 = &plVar6->_ref_count;
          *puVar1 = *puVar1 + 1;
        }
        if (local_70.ptr != (rrb<int,_false,_6> *)0x0) {
          (local_70.ptr)->_ref_count = 1;
        }
        rrb_details::push_down_tail<int,false,6>((rrb_details *)&local_78,left,&local_70,&local_80);
        piVar14 = (int *)malloc(0x28);
        piVar14[0] = 0;
        piVar14[1] = 0;
        piVar14[2] = 0;
        piVar14[4] = 0;
        piVar14[5] = 0;
        piVar14[6] = 0;
        piVar14[7] = 0;
        local_88.ptr = (rrb<int,_false,_6> *)malloc(0x18);
        (local_88.ptr)->cnt = 0;
        (local_88.ptr)->shift = 0;
        ((local_88.ptr)->tail).ptr = (leaf_node<int,_false> *)0x0;
        *(undefined4 *)&(local_88.ptr)->field_0xc = 0;
        (local_88.ptr)->tail_len = 1;
        ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=
                  ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)(piVar14 + 4),
                   (ref<immutable::rrb_details::leaf_node<int,_false>_> *)&local_88);
        if ((local_88.ptr != (rrb<int,_false,_6> *)0x0) &&
           (uVar13 = (local_88.ptr)->tail_len, (local_88.ptr)->tail_len = uVar13 - 1, uVar13 == 1))
        {
          free(local_88.ptr);
        }
        *(int **)this = piVar14;
        piVar14[8] = 1;
        if ((local_78.ptr != (rrb<int,_false,_6> *)0x0) &&
           (prVar3 = right->ptr, prVar3 != (rrb<int,_false,_6> *)0x0)) {
          *piVar14 = prVar3->cnt + (local_78.ptr)->cnt;
          rrb_details::concat_sub_tree<int,false,6>
                    ((rrb_details *)&local_60,&(local_78.ptr)->root,(local_78.ptr)->shift,
                     &prVar3->root,prVar3->shift,true);
          local_58.ptr = (tree_node<int,_false> *)local_60.ptr;
          if (local_60.ptr != (internal_node<int,_false> *)0x0) {
            (local_60.ptr)->_ref_count = (local_60.ptr)->_ref_count + 1;
          }
          uVar13 = rrb_details::find_shift<int,false,6>(&local_58);
          lVar7 = *(long *)this;
          if (lVar7 != 0) {
            *(uint32_t *)(lVar7 + 4) = uVar13;
            rrb_details::set_sizes<int,false,6>
                      ((rrb_details *)&local_40,&local_60,*(uint32_t *)(lVar7 + 4));
            lVar7 = *(long *)this;
            if (lVar7 != 0) {
              if (local_40 != (internal_node<int,_false> *)0x0) {
                local_40->_ref_count = local_40->_ref_count + 1;
              }
              local_88.ptr = *(rrb<int,_false,_6> **)(lVar7 + 0x18);
              *(internal_node<int,_false> **)(lVar7 + 0x18) = local_40;
              ref<immutable::rrb_details::tree_node<int,_false>_>::~ref
                        ((ref<immutable::rrb_details::tree_node<int,_false>_> *)&local_88);
              rrb_details::release<int>(local_40);
              if ((right->ptr != (rrb<int,_false,_6> *)0x0) && (*(long *)this != 0)) {
                ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=
                          ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)
                           (*(long *)this + 0x10),&right->ptr->tail);
                if ((right->ptr != (rrb<int,_false,_6> *)0x0) && (*(long *)this != 0)) {
                  *(uint32_t *)(*(long *)this + 8) = right->ptr->tail_len;
                  ref<immutable::rrb_details::tree_node<int,_false>_>::~ref(&local_58);
                  rrb_details::release<int>(local_60.ptr);
                  ref<immutable::rrb<int,_false,_6>_>::~ref(&local_78);
                  ref<immutable::rrb<int,_false,_6>_>::~ref(&local_70);
                  if (local_80.ptr == (leaf_node<int,_false> *)0x0) {
                    return (ref<immutable::rrb<int,_false,_6>_>)(rrb<int,_false,_6> *)this;
                  }
                  uVar13 = (local_80.ptr)->_ref_count;
                  (local_80.ptr)->_ref_count = uVar13 - 1;
                  if (uVar13 != 1) {
                    return (ref<immutable::rrb<int,_false,_6>_>)(rrb<int,_false,_6> *)this;
                  }
                  free(local_80.ptr);
                  return (ref<immutable::rrb<int,_false,_6>_>)(rrb<int,_false,_6> *)this;
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0014b3b6:
  __function = 
  "T *immutable::ref<immutable::rrb<int, false, 6>>::operator->() const [T = immutable::rrb<int, false, 6>]"
  ;
LAB_0014b3cb:
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,__function);
}

Assistant:

T* ref<T>::operator->() const
      {
      assert(ptr != nullptr);
      return ptr;
      }